

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O1

UINT8 __thiscall GYMPlayer::LoadFile(GYMPlayer *this,DATA_LOADER *dataLoader)

{
  pointer puVar1;
  UINT8 UVar2;
  UINT32 UVar3;
  UINT8 *pUVar4;
  bool bVar5;
  
  this->_dLoad = (DATA_LOADER *)0x0;
  DataLoader_ReadUntil(dataLoader,0x1ac);
  pUVar4 = DataLoader_GetData(dataLoader);
  this->_fileData = pUVar4;
  UVar3 = DataLoader_GetSize(dataLoader);
  UVar2 = 0xf0;
  if (3 < UVar3) {
    bVar5 = *(int *)this->_fileData == 0x584d5947;
    puVar1 = (this->_decFData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->_fileHdr).hasHeader = bVar5;
    if ((this->_decFData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (this->_decFData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    if (bVar5) {
      UVar3 = DataLoader_GetSize(dataLoader);
      if (UVar3 < 0x1ac) {
        return 0xf1;
      }
      pUVar4 = this->_fileData;
      (this->_fileHdr).loopFrame = *(UINT32 *)(pUVar4 + 0x1a4);
      (this->_fileHdr).uncomprSize = *(UINT32 *)(pUVar4 + 0x1a8);
      UVar3 = 0x1ac;
    }
    else {
      (this->_fileHdr).uncomprSize = 0;
      (this->_fileHdr).loopFrame = 0;
      UVar3 = 0;
    }
    (this->_fileHdr).dataOfs = UVar3;
    this->_dLoad = dataLoader;
    DataLoader_ReadAll(dataLoader);
    pUVar4 = DataLoader_GetData(this->_dLoad);
    this->_fileData = pUVar4;
    UVar3 = DataLoader_GetSize(this->_dLoad);
    this->_fileLen = UVar3;
    LoadTags(this);
    if (((this->_fileHdr).uncomprSize != 0) &&
       (UVar2 = DecompressZlibData(this), (char)UVar2 < '\0')) {
      return 0xff;
    }
    (this->_fileHdr).realFileSize = this->_fileLen;
    CalcSongLength(this);
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

UINT8 GYMPlayer::LoadFile(DATA_LOADER *dataLoader)
{
	_dLoad = NULL;
	DataLoader_ReadUntil(dataLoader,0x1AC);	// try to read the full GYMX header
	_fileData = DataLoader_GetData(dataLoader);
	if (DataLoader_GetSize(dataLoader) < 0x04)
		return 0xF0;	// invalid file
	
	_fileHdr.hasHeader = ! memcmp(&_fileData[0x00], "GYMX", 4);
	_decFData.clear();
	if (! _fileHdr.hasHeader)
	{
		_fileHdr.uncomprSize = 0;
		_fileHdr.loopFrame = 0;
		_fileHdr.dataOfs = 0x00;
	}
	else
	{
		if (DataLoader_GetSize(dataLoader) < 0x1AC)
			return 0xF1;	// file too small
		_fileHdr.loopFrame = ReadLE32(&_fileData[0x1A4]);
		_fileHdr.uncomprSize = ReadLE32(&_fileData[0x1A8]);
		_fileHdr.dataOfs = 0x1AC;
	}
	
	_dLoad = dataLoader;
	DataLoader_ReadAll(_dLoad);
	_fileData = DataLoader_GetData(_dLoad);
	_fileLen = DataLoader_GetSize(_dLoad);
	
	LoadTags();
	
	if (_fileHdr.uncomprSize > 0)
	{
		UINT8 retVal = DecompressZlibData();
		if (retVal & 0x80)
			return 0xFF;	// decompression error
	}
	_fileHdr.realFileSize = _fileLen;
	
	CalcSongLength();
	
	return 0x00;
}